

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaLoader::StoreAnimations
          (ColladaLoader *this,aiScene *pScene,ColladaParser *pParser,Animation *pSrcAnim,
          string *pPrefix)

{
  size_type sVar1;
  pointer pcVar2;
  long *plVar3;
  size_type *psVar4;
  pointer ppAVar5;
  string animName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  sVar1 = pPrefix->_M_string_length;
  if (sVar1 == 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar2 = (pSrcAnim->mName)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + (pSrcAnim->mName)._M_string_length);
  }
  else {
    local_50[0] = local_40;
    pcVar2 = (pPrefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)local_50,pcVar2,pcVar2 + sVar1);
    std::__cxx11::string::append((char *)local_50);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_50,(ulong)(pSrcAnim->mName)._M_dataplus._M_p);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_70.field_2._M_allocated_capacity = *psVar4;
      local_70.field_2._8_8_ = plVar3[3];
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar4;
      local_70._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_70._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
  }
  if ((sVar1 != 0) && (local_50[0] != local_40)) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  ppAVar5 = (pSrcAnim->mSubAnims).
            super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppAVar5 !=
      (pSrcAnim->mSubAnims).
      super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      StoreAnimations(this,pScene,pParser,*ppAVar5,&local_70);
      ppAVar5 = ppAVar5 + 1;
    } while (ppAVar5 !=
             (pSrcAnim->mSubAnims).
             super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((pSrcAnim->mChannels).
      super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pSrcAnim->mChannels).
      super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    CreateAnimation(this,pScene,pParser,pSrcAnim,&local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ColladaLoader::StoreAnimations(aiScene* pScene, const ColladaParser& pParser, const Collada::Animation* pSrcAnim, const std::string &pPrefix)
{
    std::string animName = pPrefix.empty() ? pSrcAnim->mName : pPrefix + "_" + pSrcAnim->mName;

    // create nested animations, if given
    for (std::vector<Collada::Animation*>::const_iterator it = pSrcAnim->mSubAnims.begin(); it != pSrcAnim->mSubAnims.end(); ++it)
        StoreAnimations(pScene, pParser, *it, animName);

    // create animation channels, if any
    if (!pSrcAnim->mChannels.empty())
        CreateAnimation(pScene, pParser, pSrcAnim, animName);
}